

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<bool> __thiscall
kj::HttpServer::listenHttpCleanDrain(HttpServer *this,AsyncIoStream *connection)

{
  int iVar1;
  TransformPromiseNodeBase *this_00;
  AsyncIoStream *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<bool> PVar2;
  Own<kj::HttpService> srv;
  Own<kj::HttpServer::Connection> obj;
  Own<kj::HttpServer::Connection> local_68;
  Own<kj::_::PromiseNode> local_58;
  Own<kj::_::PromiseNode> local_48;
  undefined1 local_38 [16];
  Promise<bool> promise;
  
  obj.disposer = (Disposer *)0x0;
  obj.ptr = (Connection *)0x0;
  iVar1 = *(int *)&connection[1].super_AsyncOutputStream._vptr_AsyncOutputStream;
  if (iVar1 == 2) {
    (**(code **)*connection[2].super_AsyncOutputStream._vptr_AsyncOutputStream)(&srv);
    heap<kj::HttpServer::Connection,kj::HttpServer&,kj::AsyncIoStream&,kj::HttpService&>
              ((kj *)&local_68,(HttpServer *)connection,in_RDX,srv.ptr);
    Own<kj::HttpServer::Connection>::operator=(&obj,&local_68);
    Own<kj::HttpServer::Connection>::dispose(&local_68);
    Own<kj::HttpServer::Connection>::attach<kj::Own<kj::HttpService>>
              (&local_68,(Own<kj::HttpService> *)&obj);
    Own<kj::HttpServer::Connection>::operator=(&obj,&local_68);
    Own<kj::HttpServer::Connection>::dispose(&local_68);
    Own<kj::HttpService>::dispose(&srv);
  }
  else if (iVar1 == 1) {
    heap<kj::HttpServer::Connection,kj::HttpServer&,kj::AsyncIoStream&,kj::HttpService&>
              ((kj *)&srv,(HttpServer *)connection,in_RDX,
               (HttpService *)connection[2].super_AsyncInputStream._vptr_AsyncInputStream);
    Own<kj::HttpServer::Connection>::operator=(&obj,(Own<kj::HttpServer::Connection> *)&srv);
    Own<kj::HttpServer::Connection>::dispose((Own<kj::HttpServer::Connection> *)&srv);
  }
  PVar2 = Connection::loop((Connection *)local_38,SUB81(obj.ptr,0));
  (*(in_RDX->super_AsyncOutputStream)._vptr_AsyncOutputStream[3])
            (&local_48,&in_RDX->super_AsyncOutputStream,PVar2.super_PromiseBase.node.ptr);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_48,
             _::
             TransformPromiseNode<bool,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:5102:62),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0042cc18;
  srv.disposer = (Disposer *)
                 &_::
                  HeapDisposer<kj::_::TransformPromiseNode<bool,kj::_::Void,kj::HttpServer::listenHttpCleanDrain(kj::AsyncIoStream&)::$_0,kj::_::PropagateException>>
                  ::instance;
  local_68.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<bool,kj::_::Void,kj::HttpServer::listenHttpCleanDrain(kj::AsyncIoStream&)::$_0,kj::_::PropagateException>>
        ::instance;
  srv.ptr = (HttpService *)0x0;
  local_58.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<bool,kj::_::Void,kj::HttpServer::listenHttpCleanDrain(kj::AsyncIoStream&)::$_0,kj::_::PropagateException>>
        ::instance;
  local_68.ptr = (Connection *)0x0;
  local_58.ptr = (PromiseNode *)this_00;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_68);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&srv);
  Promise<bool>::exclusiveJoin(&promise,(Promise<bool> *)local_38);
  Own<kj::_::PromiseNode>::dispose(&local_58);
  Own<kj::_::PromiseNode>::dispose(&local_48);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_38);
  Promise<bool>::attach<kj::Own<kj::HttpServer::Connection>>
            ((Promise<bool> *)&srv,(Own<kj::HttpServer::Connection> *)&promise);
  Promise<bool>::eagerlyEvaluate((Promise<bool> *)this,&srv);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&srv);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
  Own<kj::HttpServer::Connection>::dispose(&obj);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<bool>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<bool> HttpServer::listenHttpCleanDrain(kj::AsyncIoStream& connection) {
  kj::Own<Connection> obj;

  KJ_SWITCH_ONEOF(service) {
    KJ_CASE_ONEOF(ptr, HttpService*) {
      obj = heap<Connection>(*this, connection, *ptr);
    }
    KJ_CASE_ONEOF(func, HttpServiceFactory) {
      auto srv = func(connection);
      obj = heap<Connection>(*this, connection, *srv);
      obj = obj.attach(kj::mv(srv));
    }
  }

  // Start reading requests and responding to them, but immediately cancel processing if the client
  // disconnects.
  auto promise = obj->loop(true)
      .exclusiveJoin(connection.whenWriteDisconnected().then([]() {return false;}));

  // Eagerly evaluate so that we drop the connection when the promise resolves, even if the caller
  // doesn't eagerly evaluate.
  return promise.attach(kj::mv(obj)).eagerlyEvaluate(nullptr);
}